

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O2

void lys_precompile_augments_deviations_revert(ly_ctx *ctx,lys_module *mod)

{
  lyd_node *plVar1;
  ulong uVar2;
  ulong uVar3;
  size_t sVar4;
  void *pvVar5;
  long lVar6;
  ulong uVar7;
  
  uVar7 = 0;
  do {
    if ((ctx->list).count <= uVar7) {
      return;
    }
    plVar1 = (ctx->list).field_2.dnodes[uVar7];
    pvVar5 = plVar1[1].priv;
    if (pvVar5 != (void *)0x0) {
      uVar2 = *(ulong *)((long)pvVar5 + -8);
      sVar4 = uVar2 * 8;
      for (uVar3 = 0; sVar4 = sVar4 - 8, uVar2 != uVar3; uVar3 = uVar3 + 1) {
        if (*(lys_module **)((long)pvVar5 + uVar3 * 8) == mod) {
          uVar2 = uVar2 - 1;
          if (uVar3 < uVar2) {
            memmove((void *)((long)pvVar5 + uVar3 * 8),(void *)((long)pvVar5 + uVar3 * 8 + 8),sVar4)
            ;
            pvVar5 = plVar1[1].priv;
            uVar2 = *(long *)((long)pvVar5 + -8) - 1;
          }
          *(ulong *)((long)pvVar5 + -8) = uVar2;
          break;
        }
      }
      if (uVar2 == 0) {
        free((void *)((long)pvVar5 + -8));
        plVar1[1].priv = (void *)0x0;
      }
    }
    lVar6 = *(long *)(plVar1 + 2);
    if (lVar6 != 0) {
      uVar2 = *(ulong *)(lVar6 + -8);
      sVar4 = uVar2 * 8;
      for (uVar3 = 0; sVar4 = sVar4 - 8, uVar2 != uVar3; uVar3 = uVar3 + 1) {
        if (*(lys_module **)(lVar6 + uVar3 * 8) == mod) {
          uVar2 = uVar2 - 1;
          if (uVar3 < uVar2) {
            memmove((void *)(lVar6 + uVar3 * 8),(void *)(lVar6 + uVar3 * 8 + 8),sVar4);
            lVar6 = *(long *)(plVar1 + 2);
            uVar2 = *(long *)(lVar6 + -8) - 1;
          }
          *(ulong *)(lVar6 + -8) = uVar2;
          break;
        }
      }
      if (uVar2 == 0) {
        free((void *)(lVar6 + -8));
        plVar1[2].hash = 0;
        plVar1[2].flags = 0;
      }
    }
    uVar7 = uVar7 + 1;
  } while( true );
}

Assistant:

void
lys_precompile_augments_deviations_revert(struct ly_ctx *ctx, const struct lys_module *mod)
{
    uint32_t i;
    LY_ARRAY_COUNT_TYPE u, count;
    struct lys_module *m;

    for (i = 0; i < ctx->list.count; ++i) {
        m = ctx->list.objs[i];

        if (m->augmented_by) {
            count = LY_ARRAY_COUNT(m->augmented_by);
            for (u = 0; u < count; ++u) {
                if (m->augmented_by[u] == mod) {
                    /* keep the order */
                    if (u < count - 1) {
                        memmove(m->augmented_by + u, m->augmented_by + u + 1, (count - u - 1) * sizeof *m->augmented_by);
                    }
                    LY_ARRAY_DECREMENT(m->augmented_by);
                    break;
                }
            }
            if (!LY_ARRAY_COUNT(m->augmented_by)) {
                LY_ARRAY_FREE(m->augmented_by);
                m->augmented_by = NULL;
            }
        }

        if (m->deviated_by) {
            count = LY_ARRAY_COUNT(m->deviated_by);
            for (u = 0; u < count; ++u) {
                if (m->deviated_by[u] == mod) {
                    /* keep the order */
                    if (u < count - 1) {
                        memmove(m->deviated_by + u, m->deviated_by + u + 1, (count - u - 1) * sizeof *m->deviated_by);
                    }
                    LY_ARRAY_DECREMENT(m->deviated_by);
                    break;
                }
            }
            if (!LY_ARRAY_COUNT(m->deviated_by)) {
                LY_ARRAY_FREE(m->deviated_by);
                m->deviated_by = NULL;
            }
        }
    }
}